

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O2

int __thiscall
coda_url::create_suburl(coda_url *this,char *u,size_t sz,uint32_t flags,coda_url *parent)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t len;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  size_t __n;
  
  pcVar1 = coda_strxstr(u,"mailto:",7);
  iVar6 = -1;
  if (((pcVar1 == (char *)0x0) &&
      (pcVar1 = coda_strxstr(u,"javascript:",0xb), pcVar1 == (char *)0x0)) && (*u != '#')) {
    uVar5 = (ulong)(parent->val_str[4] == 's');
    pcVar2 = coda_strnchr(parent->val_str + uVar5 + 7,'/',(ulong)parent->val_len - (uVar5 + 7));
    pcVar1 = parent->val_str;
    pcVar3 = coda_strnchr(u,'#',sz);
    __n = (long)pcVar3 - (long)u;
    if (pcVar3 == (char *)0x0) {
      __n = sz;
    }
    pcVar3 = parent->val_str;
    pcVar4 = pcVar2 + -(long)pcVar1;
    if (*u != '/') {
      len = coda_strnchp(pcVar3,'?',(ulong)parent->val_len);
      pcVar4 = coda_revnchr(parent->val_str,'/',len);
      pcVar3 = parent->val_str;
      pcVar4 = pcVar4 + (1 - (long)pcVar3);
    }
    memcpy(this->val_str,pcVar3,(size_t)pcVar4);
    memcpy(this->val_str + (long)pcVar4,u,__n);
    this->val_len = (int)pcVar4 + (int)__n;
    this->dom_len = parent->dom_len;
    this->dom_str = parent->dom_str;
    assign_refers(this,pcVar2 + -(long)pcVar1 + (long)this->val_str,flags);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int coda_url::create_suburl(const char *u, size_t sz, uint32_t flags, const coda_url &parent)
{
	if (NULL != coda_strxstr(u, "mailto:", 7)) return -1;
	if (NULL != coda_strxstr(u, "javascript:", 11)) return -1;
	if ( '#' == *u) return -1;

	size_t sz_dom = (parent.val_str[4] != 's' ? 7 : 8);
	size_t sz_pub = sz_dom = coda_strnchr(parent.val_str + sz_dom,
		'/', parent.val_len - sz_dom) - parent.val_str;

	char *p = coda_strnchr(u, '#', sz);
	if (NULL != p) sz = p - u;

	if ('/' != *u)
	{
		sz_pub = coda_strnchp(parent.val_str, '?', parent.val_len);
		sz_pub = coda_revnchr(parent.val_str, '/', sz_pub) - parent.val_str + 1;
	}

	val_len = coda_cpymsz(val_str, parent.val_str, sz_pub)
			+ coda_cpymsz(val_str + sz_pub, u, sz);

	dom_len = parent.dom_len;
	dom_str = parent.dom_str;

	return assign_refers(val_str + sz_dom, flags);
}